

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

ReaderData * __thiscall BufferedReader::getReader(BufferedReader *this,int readerID)

{
  bool bVar1;
  pointer ppVar2;
  ReaderData *local_58;
  _Self local_40 [3];
  _Self local_28;
  iterator itr;
  lock_guard<std::mutex> lock;
  int readerID_local;
  BufferedReader *this_local;
  
  lock._M_device._4_4_ = readerID;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,&this->m_readersMtx);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::find(&this->m_readers,(key_type_conflict *)((long)&lock._M_device + 4));
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::end(&this->m_readers);
  bVar1 = std::operator!=(&local_28,local_40);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>::operator->(&local_28);
    local_58 = ppVar2->second;
  }
  else {
    local_58 = (ReaderData *)0x0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  return local_58;
}

Assistant:

ReaderData* BufferedReader::getReader(const int readerID)
{
    std::lock_guard lock(m_readersMtx);
    const auto itr = m_readers.find(readerID);
    return itr != m_readers.end() ? itr->second : nullptr;
}